

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshAssignWeights
              (word *t,char *pIsop,char *pIsopFneg,int nVars,int *pW,int *pChow,int nChows,int Wmin)

{
  bool bVar1;
  int iVar2;
  int *__ptr;
  size_t sVar3;
  size_t sVar4;
  unsigned_long **pGreaters;
  unsigned_long *puVar5;
  unsigned_long **pSmallers;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int Cost;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int i;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  int in_stack_ffffffffffffff68;
  
  lVar17 = (long)nChows;
  __ptr = (int *)malloc(lVar17 * 4);
  sVar3 = strlen(pIsop);
  piVar6 = (int *)(ulong)(nVars + 3U);
  uVar15 = (ulong)(int)(nVars + 3U);
  sVar4 = strlen(pIsopFneg);
  iVar2 = (int)(sVar4 / uVar15) * (int)(sVar3 / uVar15);
  lVar11 = (long)iVar2;
  sVar3 = lVar11 * 8;
  pGreaters = (unsigned_long **)malloc(sVar3);
  if (iVar2 < 1) {
    pSmallers = (unsigned_long **)malloc(sVar3);
  }
  else {
    lVar18 = 0;
    do {
      puVar5 = (unsigned_long *)malloc(lVar17 * 8);
      pGreaters[lVar18] = puVar5;
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar11);
    pSmallers = (unsigned_long **)malloc(sVar3);
    if (0 < iVar2) {
      lVar18 = 0;
      do {
        puVar5 = (unsigned_long *)malloc(lVar17 * 8);
        pSmallers[lVar18] = puVar5;
        lVar18 = lVar18 + 1;
      } while (lVar18 < lVar11);
    }
  }
  Extra_ThreshCreateInequalities
            (pIsop,pIsopFneg,nVars,piVar6,pChow,nChows,in_stack_ffffffffffffff68,pGreaters,pSmallers
            );
  Extra_ThreshSimplifyInequalities(iVar2,nChows,pGreaters,pSmallers);
  *__ptr = Wmin;
  uVar7 = (ulong)(uint)nChows;
  if (1 < nChows) {
    iVar10 = *__ptr;
    uVar9 = 1;
    do {
      __ptr[uVar9] = iVar10 + (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (0 < nChows) {
    uVar9 = 0;
    bVar1 = false;
    iVar10 = -1000;
    piVar6 = __ptr;
    lVar18 = lVar17;
    do {
      if (nVars * 2 < __ptr[lVar17 + -1]) break;
      if (0 < iVar2) {
        iVar12 = 0;
        do {
          if (pGreaters[iVar12][uVar9] == 0) {
LAB_007bbc06:
            iVar12 = iVar12 + 1;
          }
          else {
            uVar19 = 0;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + __ptr[uVar19] * (int)pGreaters[iVar12][uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar7 != uVar19);
            uVar19 = 0;
            iVar16 = 0;
            do {
              iVar16 = iVar16 + __ptr[uVar19] * (int)pSmallers[iVar12][uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar7 != uVar19);
            iVar14 = iVar13 - iVar16;
            if (iVar14 == 0 || iVar13 < iVar16) {
              if (iVar10 < iVar14) {
                lVar8 = 0;
                do {
                  piVar6[lVar8] = piVar6[lVar8] + 1;
                  lVar8 = lVar8 + 1;
                } while (lVar18 != lVar8);
                bVar1 = true;
                iVar10 = iVar14;
              }
              else {
                if (!bVar1) {
                  bVar1 = false;
                  goto LAB_007bbc06;
                }
                lVar8 = 0;
                do {
                  piVar6[lVar8] = piVar6[lVar8] + -1;
                  lVar8 = lVar8 + 1;
                } while (lVar18 != lVar8);
                iVar12 = iVar12 + 1;
                bVar1 = false;
                iVar10 = -1000;
              }
            }
            else {
              iVar12 = iVar12 + 1;
              if (bVar1) {
                iVar10 = -1000;
                iVar12 = 0;
              }
              bVar1 = false;
            }
          }
        } while (iVar12 < iVar2);
      }
      uVar9 = uVar9 + 1;
      lVar18 = lVar18 + -1;
      piVar6 = piVar6 + 1;
    } while (uVar9 != uVar7);
  }
  if (iVar2 < 1) {
    free(pGreaters);
  }
  else {
    lVar17 = 0;
    do {
      free(pGreaters[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 < lVar11);
    free(pGreaters);
    if (0 < iVar2) {
      lVar17 = 0;
      do {
        free(pSmallers[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 < lVar11);
    }
  }
  free(pSmallers);
  sVar3 = strlen(pIsop);
  if ((int)(uint)sVar3 < 1) {
    iVar2 = 1000;
  }
  else {
    iVar2 = 1000;
    lVar11 = 0;
    do {
      iVar10 = 0;
      if (0 < nVars) {
        iVar10 = 0;
        piVar6 = pChow;
        lVar17 = lVar11;
        do {
          if (pIsop[lVar17] == '1') {
            iVar10 = iVar10 + __ptr[*piVar6];
          }
          lVar17 = lVar17 + 1;
          piVar6 = piVar6 + 1;
        } while (lVar17 < lVar11 + nVars);
      }
      if (iVar2 < iVar10) {
        iVar10 = iVar2;
      }
      iVar2 = iVar10;
      lVar11 = lVar11 + uVar15;
    } while (lVar11 < (long)(ulong)((uint)sVar3 & 0x7fffffff));
  }
  sVar3 = strlen(pIsopFneg);
  if ((int)(uint)sVar3 < 1) {
    iVar10 = 0;
  }
  else {
    lVar11 = 0;
    iVar10 = 0;
    do {
      iVar12 = 0;
      if (0 < nVars) {
        iVar12 = 0;
        piVar6 = pChow;
        lVar17 = lVar11;
        do {
          if (pIsopFneg[lVar17] == '-') {
            iVar12 = iVar12 + __ptr[*piVar6];
          }
          lVar17 = lVar17 + 1;
          piVar6 = piVar6 + 1;
        } while (lVar17 < lVar11 + nVars);
      }
      if (iVar12 < iVar10) {
        iVar12 = iVar10;
      }
      iVar10 = iVar12;
      lVar11 = lVar11 + uVar15;
    } while (lVar11 < (long)(ulong)((uint)sVar3 & 0x7fffffff));
  }
  if (0 < nVars) {
    uVar15 = 0;
    do {
      pW[uVar15] = __ptr[pChow[uVar15]];
      uVar15 = uVar15 + 1;
    } while ((uint)nVars != uVar15);
  }
  free(__ptr);
  iVar12 = 0;
  if (iVar10 < iVar2) {
    iVar12 = iVar2;
  }
  return iVar12;
}

Assistant:

int Extra_ThreshAssignWeights(word * t, char * pIsop, char * pIsopFneg,
		int nVars, int * pW, int * pChow, int nChows, int Wmin) {

	int i = 0, j = 0, Lmin = 1000, Lmax = 0, Limit = nVars * 2, delta = 0,
			deltaOld = -1000, fIncremented = 0;
	//******************************
	int * pWofChow = ABC_ALLOC( int, nChows );
	int nCubesIsop = strlen(pIsop) / (nVars + 3);
	int nCubesIsopFneg = strlen(pIsopFneg) / (nVars + 3);
	int nInequalities = nCubesIsop * nCubesIsopFneg;
	unsigned long **pGreaters;
	unsigned long **pSmallers;

	pGreaters = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pGreaters);
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		pGreaters[i] = (unsigned long *)malloc(nChows * sizeof *pGreaters[i]);
	}
	pSmallers = (unsigned long **)malloc(nCubesIsop * nCubesIsopFneg * sizeof *pSmallers);
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		pSmallers[i] = (unsigned long *)malloc(nChows * sizeof *pSmallers[i]);
	}

	//******************************
	Extra_ThreshCreateInequalities(pIsop, pIsopFneg, nVars, pWofChow, pChow,
			nChows, nInequalities, pGreaters, pSmallers);
	Extra_ThreshSimplifyInequalities(nInequalities, nChows, pGreaters,
			pSmallers);

	//initializes the weights
	pWofChow[0] = Wmin;
	for (i = 1; i < nChows; i++) {
		pWofChow[i] = pWofChow[i - 1] + 1;
	}
	i = 0;

	//assign the weights respecting the inequalities
	while (i < nChows && pWofChow[nChows - 1] <= Limit) {
		Lmin = 1000;
		Lmax = 0;

		while (j < nInequalities) {
			if (pGreaters[j][i] != 0) {
				Lmin = Extra_ThreshCubeWeightedSum3(pWofChow, nChows, pGreaters,
						j);
				Lmax = Extra_ThreshCubeWeightedSum4(pWofChow, nChows, pSmallers,
						j);
				delta = Lmin - Lmax;

				if (delta > 0) {
					if (fIncremented == 1) {
						j = 0;
						fIncremented = 0;
						deltaOld = -1000;
					} else
						j++;
					continue;
				}
				if (delta > deltaOld) {
					Extra_ThreshIncrementWeights(nChows, pWofChow, i);
					deltaOld = delta;
					fIncremented = 1;
				} else if (fIncremented == 1) {
					Extra_ThreshDecrementWeights(nChows, pWofChow, i);
					j++;
					deltaOld = -1000;
					fIncremented = 0;
					continue;
				} else
					j++;
			} else
				j++;

		}
		i++;
		j = 0;
	}

	//******************************
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		free(pGreaters[i]);
	}
	free(pGreaters);
	for (i = 0; i < nCubesIsop * nCubesIsopFneg; i++) {
		free(pSmallers[i]);
	}
	free(pSmallers);
	//******************************

	i = 0;
	Lmin = 1000;
	Lmax = 0;

	//check the assigned weights in the original system
	for (j = 0; j < (int)strlen(pIsop); j += (nVars + 3))
		Lmin = Abc_MinInt(Lmin,
				Extra_ThreshCubeWeightedSum1(pWofChow, pChow, pIsop, nVars, j));
	for (j = 0; j < (int)strlen(pIsopFneg); j += (nVars + 3))
		Lmax = Abc_MaxInt(Lmax,
				Extra_ThreshCubeWeightedSum2(pWofChow, pChow, pIsopFneg, nVars,
						j));

	for (i = 0; i < nVars; i++) {
		pW[i] = pWofChow[pChow[i]];
	}

    ABC_FREE( pWofChow );
	if (Lmin > Lmax)
		return Lmin;
	else
		return 0;
}